

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O1

void LoadFunction(LoadState *S,Proto *fp,TString *psource)

{
  SharedProto *pSVar1;
  int iVar2;
  uint uVar3;
  ulong in_RAX;
  TString *pTVar4;
  Instruction *b;
  TValue *pTVar5;
  Upvaldesc *pUVar6;
  Proto **ppPVar7;
  long lVar8;
  Proto *pPVar9;
  int *b_00;
  LocVar *pLVar10;
  size_t sVar11;
  long lVar12;
  size_t sVar13;
  int x;
  ulong local_38;
  
  pSVar1 = fp->sp;
  local_38 = in_RAX;
  pTVar4 = LoadString(S);
  if (pTVar4 != (TString *)0x0) {
    psource = pTVar4;
  }
  pSVar1->source = psource;
  LoadBlock(S,&local_38,4);
  pSVar1->linedefined = (int)local_38;
  LoadBlock(S,&local_38,4);
  pSVar1->lastlinedefined = (int)local_38;
  LoadBlock(S,&local_38,1);
  pSVar1->numparams = (byte)local_38;
  LoadBlock(S,&local_38,1);
  pSVar1->is_vararg = (byte)local_38;
  LoadBlock(S,&local_38,1);
  pSVar1->maxstacksize = (byte)local_38;
  LoadBlock(S,&local_38,4);
  iVar2 = (int)local_38;
  lVar12 = (long)(int)local_38;
  b = (Instruction *)luaM_realloc_(S->L,(void *)0x0,0,lVar12 << 2);
  pSVar1->code = b;
  pSVar1->sizecode = iVar2;
  LoadBlock(S,b,lVar12 << 2);
  LoadBlock(S,&local_38,4);
  iVar2 = (int)local_38;
  lVar12 = (long)(int)local_38;
  sVar13 = lVar12 << 4;
  pTVar5 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,sVar13);
  fp->k = pTVar5;
  fp->sp->sizek = iVar2;
  if (0 < lVar12) {
    sVar11 = 0;
    do {
      *(undefined4 *)((long)&pTVar5->tt_ + sVar11) = 0;
      sVar11 = sVar11 + 0x10;
    } while (sVar13 != sVar11);
    if (0 < iVar2) {
      sVar11 = 0;
      do {
        pTVar5 = fp->k;
        LoadBlock(S,&local_38,1);
        uVar3 = (uint)(byte)local_38;
        switch(local_38 & 0xff) {
        case 0:
          break;
        case 1:
          LoadBlock(S,&local_38,1);
          *(uint *)((long)&pTVar5->value_ + sVar11) = (uint)(byte)local_38;
          uVar3 = 1;
          break;
        case 2:
          goto switchD_00146959_caseD_2;
        case 3:
          LoadBlock(S,&local_38,8);
          *(ulong *)((long)&pTVar5->value_ + sVar11) = local_38;
          uVar3 = 3;
          break;
        case 4:
switchD_00146959_caseD_4:
          pTVar4 = LoadString(S);
          *(TString **)((long)&pTVar5->value_ + sVar11) = pTVar4;
          uVar3 = pTVar4->tt | 0x40;
          break;
        default:
          if ((byte)local_38 == 0x13) {
            LoadBlock(S,&local_38,8);
            *(ulong *)((long)&pTVar5->value_ + sVar11) = local_38;
            uVar3 = 0x13;
            break;
          }
          if ((byte)local_38 == 0x14) goto switchD_00146959_caseD_4;
          goto switchD_00146959_caseD_2;
        }
        *(uint *)((long)&pTVar5->tt_ + sVar11) = uVar3;
switchD_00146959_caseD_2:
        sVar11 = sVar11 + 0x10;
      } while (sVar13 != sVar11);
    }
  }
  LoadBlock(S,&local_38,4);
  iVar2 = (int)local_38;
  lVar12 = (long)(int)local_38;
  sVar13 = lVar12 << 4;
  pUVar6 = (Upvaldesc *)luaM_realloc_(S->L,(void *)0x0,0,sVar13);
  pSVar1->upvalues = pUVar6;
  pSVar1->sizeupvalues = iVar2;
  if (0 < lVar12) {
    sVar11 = 0;
    do {
      *(undefined8 *)((long)&pUVar6->name + sVar11) = 0;
      sVar11 = sVar11 + 0x10;
    } while (sVar13 != sVar11);
    if (0 < iVar2) {
      sVar11 = 0;
      do {
        LoadBlock(S,&local_38,1);
        (&pSVar1->upvalues->instack)[sVar11] = (byte)local_38;
        LoadBlock(S,&local_38,1);
        (&pSVar1->upvalues->idx)[sVar11] = (byte)local_38;
        sVar11 = sVar11 + 0x10;
      } while (sVar13 != sVar11);
    }
  }
  LoadBlock(S,&local_38,4);
  iVar2 = (int)local_38;
  lVar12 = (long)(int)local_38;
  ppPVar7 = (Proto **)luaM_realloc_(S->L,(void *)0x0,0,lVar12 * 8);
  fp->p = ppPVar7;
  fp->sp->sizep = iVar2;
  if (0 < lVar12) {
    lVar8 = 0;
    do {
      fp->p[lVar8] = (Proto *)0x0;
      lVar8 = lVar8 + 1;
    } while (lVar12 != lVar8);
  }
  if (0 < iVar2) {
    lVar8 = 0;
    do {
      pPVar9 = luaF_newproto(S->L,(SharedProto *)0x0);
      fp->p[lVar8] = pPVar9;
      LoadFunction(S,fp->p[lVar8],fp->sp->source);
      lVar8 = lVar8 + 1;
    } while (lVar12 != lVar8);
  }
  LoadBlock(S,&local_38,4);
  iVar2 = (int)local_38;
  lVar12 = (long)(int)local_38;
  b_00 = (int *)luaM_realloc_(S->L,(void *)0x0,0,lVar12 << 2);
  pSVar1->lineinfo = b_00;
  pSVar1->sizelineinfo = iVar2;
  LoadBlock(S,b_00,lVar12 << 2);
  LoadBlock(S,&local_38,4);
  iVar2 = (int)local_38;
  lVar12 = (long)(int)local_38;
  sVar13 = lVar12 << 4;
  pLVar10 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,sVar13);
  pSVar1->locvars = pLVar10;
  pSVar1->sizelocvars = iVar2;
  if (0 < lVar12) {
    sVar11 = 0;
    do {
      *(undefined8 *)((long)&pLVar10->varname + sVar11) = 0;
      sVar11 = sVar11 + 0x10;
    } while (sVar13 != sVar11);
    if (0 < iVar2) {
      sVar11 = 0;
      do {
        pTVar4 = LoadString(S);
        *(TString **)((long)&pSVar1->locvars->varname + sVar11) = pTVar4;
        LoadBlock(S,&local_38,4);
        *(int *)((long)&pSVar1->locvars->startpc + sVar11) = (int)local_38;
        LoadBlock(S,&local_38,4);
        *(int *)((long)&pSVar1->locvars->endpc + sVar11) = (int)local_38;
        sVar11 = sVar11 + 0x10;
      } while (sVar13 != sVar11);
    }
  }
  LoadBlock(S,&local_38,4);
  if (0 < (long)(int)local_38) {
    lVar12 = 0;
    do {
      pTVar4 = LoadString(S);
      *(TString **)((long)&pSVar1->upvalues->name + lVar12) = pTVar4;
      lVar12 = lVar12 + 0x10;
    } while ((long)(int)local_38 * 0x10 != lVar12);
  }
  return;
}

Assistant:

static void LoadFunction (LoadState *S, Proto *fp, TString *psource) {
  SharedProto *f = fp->sp;
  f->source = LoadString(S);
  if (f->source == NULL)  /* no source in dump? */
    f->source = psource;  /* reuse parent's source */
  f->linedefined = LoadInt(S);
  f->lastlinedefined = LoadInt(S);
  f->numparams = LoadByte(S);
  f->is_vararg = LoadByte(S);
  f->maxstacksize = LoadByte(S);
  LoadCode(S, f);
  LoadConstants(S, fp);
  LoadUpvalues(S, f);
  LoadProtos(S, fp);
  LoadDebug(S, f);
}